

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsUtils.cpp
# Opt level: O1

HighsInt dataSize(HighsIndexCollection *index_collection)

{
  if (index_collection->is_set_ == true) {
    return index_collection->set_num_entries_;
  }
  if (index_collection->is_interval_ == true) {
    return (index_collection->to_ - index_collection->from_) + 1;
  }
  return index_collection->dimension_;
}

Assistant:

HighsInt dataSize(const HighsIndexCollection& index_collection) {
  if (index_collection.is_set_) {
    return index_collection.set_num_entries_;
  } else {
    if (index_collection.is_interval_) {
      return index_collection.to_ - index_collection.from_ + 1;
    } else {
      return index_collection.dimension_;
    }
  }
}